

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.h
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::~TargetCodeGenerator(TargetCodeGenerator *this)

{
  TargetCodeGenerator *this_local;
  
  ~TargetCodeGenerator(this);
  operator_delete(this,0x2b8);
  return;
}

Assistant:

~TargetCodeGenerator() = default;